

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O0

_Bool xfer_recv_shutdown_started(Curl_easy *data)

{
  int sockindex;
  Curl_easy *data_local;
  
  if ((data == (Curl_easy *)0x0) || (data->conn == (connectdata *)0x0)) {
    data_local._7_1_ = true;
  }
  else if (data->conn->sockfd == -1) {
    data_local._7_1_ = true;
  }
  else {
    data_local._7_1_ = Curl_shutdown_started(data,(uint)(data->conn->sockfd == data->conn->sock[1]))
    ;
  }
  return data_local._7_1_;
}

Assistant:

static bool xfer_recv_shutdown_started(struct Curl_easy *data)
{
  int sockindex;

  if(!data || !data->conn)
    return CURLE_FAILED_INIT;
  if(data->conn->sockfd == CURL_SOCKET_BAD)
    return CURLE_FAILED_INIT;
  sockindex = (data->conn->sockfd == data->conn->sock[SECONDARYSOCKET]);
  return Curl_shutdown_started(data, sockindex);
}